

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw_bwt.h
# Opt level: O1

void __thiscall bwtil::cw_bwt::computeEmpiricalEntropy(cw_bwt *this)

{
  uint uVar1;
  ulint uVar2;
  pointer puVar3;
  pointer pvVar4;
  unsigned_long uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulint uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 extraout_var [56];
  undefined1 auVar15 [16];
  double dVar14;
  undefined1 auVar16 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar17 [64];
  undefined1 in_XMM4 [16];
  double local_70;
  
  this->Hk = 0.0;
  uVar2 = this->number_of_contexts;
  if (uVar2 != 0) {
    local_70 = this->Hk;
    puVar3 = (this->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar1 = this->sigma;
    pvVar4 = (this->frequencies).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    auVar7 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,this->n);
    uVar10 = 0;
    do {
      uVar5 = puVar3[uVar10];
      if (uVar5 != 0) {
        if (uVar1 == 0) {
          dVar14 = 0.0;
        }
        else {
          lVar6 = *(long *)&pvVar4[uVar10].
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data;
          uVar11 = (long)*(pointer *)
                          ((long)&pvVar4[uVar10].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data + 8) - lVar6 >> 3;
          auVar8 = vcvtusi2sd_avx512f(in_XMM4,uVar5);
          auVar17 = ZEXT864(0);
          uVar12 = 0;
          do {
            auVar15._0_8_ = auVar17._0_8_;
            if (uVar11 <= uVar12) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar12,uVar11);
            }
            auVar9 = vcvtusi2sd_avx512f(in_XMM4,*(undefined8 *)(lVar6 + uVar12 * 8));
            dVar14 = auVar9._0_8_ * (1.0 / auVar8._0_8_);
            if (0.0 < dVar14) {
              auVar17._0_8_ = log2(dVar14);
              auVar17._8_56_ = extraout_var;
              auVar15._8_8_ = 0;
              auVar9._8_8_ = 0;
              auVar9._0_8_ = dVar14;
              auVar15 = vfnmadd231sd_fma(auVar15,auVar17._0_16_,auVar9);
              auVar17 = ZEXT1664(auVar15);
            }
            dVar14 = auVar17._0_8_;
            uVar12 = uVar12 + 1;
          } while (uVar1 != (uint)uVar12);
        }
        auVar15 = vcvtusi2sd_avx512f(in_XMM4,uVar5);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = local_70;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = 1.0 / auVar7._0_8_;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = dVar14 * auVar15._0_8_;
        auVar8 = vfmadd231sd_fma(auVar16,auVar13,auVar8);
        local_70 = auVar8._0_8_;
        this->Hk = local_70;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar2);
  }
  return;
}

Assistant:

void computeEmpiricalEntropy(){

		//warning:to be called AFTER initialization of structures

		Hk = 0;//k-order empirical entropy

		for(ulint i=0;i<number_of_contexts;i++){//for each non-empty context

			if(lengths[i]>0){

				double H0=0;//0-order entropy of this context

				for(uint s=0;s<sigma;s++){//for each symbol in the alphabet

					double f = (double)frequencies[i].at(s)/(double)lengths[i];

					if(f>0)
						H0 += -f*log2(f);

				}

				Hk += H0*((double)lengths[i]/(double)n);

			}
		}

	}